

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall
cplus::socket::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  char *__cp;
  SocketException *pSVar2;
  int *piVar3;
  allocator local_b2;
  allocator local_b1;
  String local_b0;
  string local_98;
  string local_78;
  String local_58;
  String local_40;
  Int local_28;
  
  iVar1 = ::socket(2,1,6);
  this->socket = iVar1;
  if (iVar1 < 0) {
    pSVar2 = (SocketException *)__cxa_allocate_exception(0x838);
    std::__cxx11::string::string
              ((string *)&local_78,"Create Socket Failed!: ",(allocator *)&local_58);
    piVar3 = __errno_location();
    local_40.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128278;
    local_40.value.super___shared_ptr<cplus::lang::CPlusString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_40.value.
                  super___shared_ptr<cplus::lang::CPlusString,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _4_4_,*piVar3);
    lang::Int::toString(&local_b0,(Int *)&local_40);
    lang::operator+((String *)&local_98,&local_78,&local_b0);
    SocketException::SocketException(pSVar2,(String *)&local_98);
    __cxa_throw(pSVar2,&SocketException::typeinfo,system::Exception::~Exception);
  }
  iVar1 = bind(iVar1,(sockaddr *)&this->local_addr,0x10);
  if (iVar1 != 0) {
    pSVar2 = (SocketException *)__cxa_allocate_exception(0x838);
    std::__cxx11::string::string
              ((string *)&local_78,"Client Bind Port Failed!: ",(allocator *)&local_58);
    piVar3 = __errno_location();
    local_40.value.super___shared_ptr<cplus::lang::CPlusString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(long)*piVar3;
    local_40.super_Object._vptr_Object = (_func_int **)&PTR_toString_001285e8;
    lang::Long::toString(&local_b0,(Long *)&local_40);
    lang::operator+((String *)&local_98,&local_78,&local_b0);
    SocketException::SocketException(pSVar2,(String *)&local_98);
    __cxa_throw(pSVar2,&SocketException::typeinfo,system::Exception::~Exception);
  }
  __cp = lang::String::c_str(&this->address);
  iVar1 = inet_aton(__cp,(in_addr *)&(this->addr).sin_addr);
  if (iVar1 == 0) {
    pSVar2 = (SocketException *)__cxa_allocate_exception(0x838);
    std::__cxx11::string::string
              ((string *)&local_78,"Server IP Address Error!: ",(allocator *)&local_58);
    piVar3 = __errno_location();
    local_40.value.super___shared_ptr<cplus::lang::CPlusString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(long)*piVar3;
    local_40.super_Object._vptr_Object = (_func_int **)&PTR_toString_001285e8;
    lang::Long::toString(&local_b0,(Long *)&local_40);
    lang::operator+((String *)&local_98,&local_78,&local_b0);
    SocketException::SocketException(pSVar2,(String *)&local_98);
    __cxa_throw(pSVar2,&SocketException::typeinfo,system::Exception::~Exception);
  }
  iVar1 = ::connect(this->socket,(sockaddr *)&this->addr,0x10);
  if (-1 < iVar1) {
    return iVar1;
  }
  pSVar2 = (SocketException *)__cxa_allocate_exception(0x838);
  std::__cxx11::string::string((string *)&local_78,"Can Not Connect To ",&local_b1);
  lang::operator+(&local_58,&local_78,&this->address);
  std::__cxx11::string::string((string *)&local_98,", error code: ",&local_b2);
  lang::String::operator+(&local_40,&local_58,&local_98);
  piVar3 = __errno_location();
  local_28.value = *piVar3;
  local_28.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128278;
  lang::operator+(&local_b0,&local_40,&local_28);
  SocketException::SocketException(pSVar2,&local_b0);
  __cxa_throw(pSVar2,&SocketException::typeinfo,system::Exception::~Exception);
}

Assistant:

void Socket::connect() {
			//创建用于internet的流协议(TCP)socket,用client_socket代表客户机socket
			socket = ::socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (socket < 0) {
				throw SocketException("Create Socket Failed!: " + lang::Int(errno).toString());
			}
			//把客户机的socket和客户机的socket地址结构联系起来
			if (::bind(socket, (struct sockaddr *) &local_addr, sizeof(local_addr))) {
				throw SocketException(
						"Client Bind Port Failed!: " + lang::Long(errno).toString());
			}
			
			if (inet_aton(address.c_str(), &addr.sin_addr) == 0) //服务器的IP地址来自程序的参数
			{
				throw SocketException(
						"Server IP Address Error!: " + lang::Long(errno).toString());
			}
			//向服务器发起连接,连接成功后client_socket代表了客户机和服务器的一个socket连接
			if (::connect(socket, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
				throw SocketException("Can Not Connect To " + address + ", error code: " +
				                      lang::Int(errno));
			}
		}